

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

SlidingWindowsLayerParams * __thiscall
CoreML::Specification::SlidingWindowsLayerParams::New(SlidingWindowsLayerParams *this,Arena *arena)

{
  SlidingWindowsLayerParams *this_00;
  
  this_00 = (SlidingWindowsLayerParams *)operator_new(0x30);
  SlidingWindowsLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::SlidingWindowsLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

SlidingWindowsLayerParams* SlidingWindowsLayerParams::New(::google::protobuf::Arena* arena) const {
  SlidingWindowsLayerParams* n = new SlidingWindowsLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}